

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,minstd_rand *rng)

{
  string_view w;
  bool bVar1;
  entry_type eVar2;
  __type _Var3;
  const_reference pvVar4;
  Dictionary *in_RDI;
  int32_t wid;
  int32_t h;
  int32_t ntokens;
  string token;
  uniform_real_distribution<double> uniform;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  real in_stack_ffffffffffffff60;
  int32_t in_stack_ffffffffffffff64;
  Dictionary *in_stack_ffffffffffffff68;
  int32_t in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int iVar5;
  int local_54;
  string local_50 [80];
  
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             8.60390618950239e-318);
  std::__cxx11::string::string(local_50);
  local_54 = 0;
  reset((Dictionary *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        (istream *)in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a92bd);
  while( true ) {
    bVar1 = readWord(in_RDI,(istream *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                     ,(string *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff74 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff74);
    if (!bVar1) break;
    w = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
    in_stack_ffffffffffffff70 =
         find((Dictionary *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),w);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->word2int_,(long)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff84 = *pvVar4;
    if (-1 < in_stack_ffffffffffffff84) {
      local_54 = local_54 + 1;
      eVar2 = getType((Dictionary *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
      iVar5 = in_stack_ffffffffffffff84;
      if (eVar2 == word) {
        in_stack_ffffffffffffff68 =
             (Dictionary *)
             std::uniform_real_distribution<double>::operator()
                       ((uniform_real_distribution<double> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff60),
                        (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        bVar1 = discard(in_stack_ffffffffffffff68,in_stack_ffffffffffffff84,
                        in_stack_ffffffffffffff60);
        in_stack_ffffffffffffff64 = in_stack_ffffffffffffff84;
        if (!bVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (value_type_conflict1 *)in_stack_ffffffffffffff68);
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff84;
        }
      }
      in_stack_ffffffffffffff84 = iVar5;
      if ((0x400 < local_54) ||
         (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_RDI), _Var3)) break;
    }
  }
  std::__cxx11::string::~string(local_50);
  return local_54;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::minstd_rand& rng) const {
  std::uniform_real_distribution<> uniform(0, 1);
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  while (readWord(in, token)) {
    int32_t h = find(token);
    int32_t wid = word2int_[h];
    if (wid < 0) {
      continue;
    }

    ntokens++;
    if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
      words.push_back(wid);
    }
    if (ntokens > MAX_LINE_SIZE || token == EOS) {
      break;
    }
  }
  return ntokens;
}